

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
operator()(ShadedRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  byte bVar3;
  GetterYs<unsigned_char> *pGVar4;
  TransformerLogLin *pTVar5;
  ImPlotPlot *pIVar6;
  GetterYRef *pGVar7;
  ImDrawVert *pIVar8;
  ImDrawIdx *pIVar9;
  double dVar10;
  undefined1 auVar11 [12];
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  ushort uVar15;
  ImDrawIdx IVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  double dVar22;
  ImVec2 IVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar42;
  undefined1 auVar38 [16];
  
  pIVar12 = GImPlot;
  pGVar4 = this->Getter1;
  pTVar5 = this->Transformer;
  dVar10 = (double)(prim + 1);
  iVar14 = pGVar4->Count;
  bVar3 = pGVar4->Ys
          [(long)(((prim + 1 + pGVar4->Offset) % iVar14 + iVar14) % iVar14) * (long)pGVar4->Stride];
  dVar22 = log10((pGVar4->XScale * dVar10 + pGVar4->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar13 = GImPlot;
  pIVar6 = pIVar12->CurrentPlot;
  dVar2 = (pIVar6->XAxis).Range.Min;
  iVar14 = pTVar5->YAxis;
  pGVar7 = this->Getter2;
  pTVar5 = this->Transformer;
  IVar1 = pIVar12->PixelRange[iVar14].Min;
  fVar24 = (float)(pIVar12->Mx *
                   (((double)(float)(dVar22 / pIVar12->LogDenX) *
                     ((pIVar6->XAxis).Range.Max - dVar2) + dVar2) - dVar2) + (double)IVar1.x);
  fVar26 = (float)(pIVar12->My[iVar14] * ((double)bVar3 - pIVar6->YAxis[iVar14].Range.Min) +
                  (double)IVar1.y);
  dVar2 = pGVar7->YRef;
  dVar22 = log10((dVar10 * pGVar7->XScale + pGVar7->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar6 = pIVar13->CurrentPlot;
  dVar10 = (pIVar6->XAxis).Range.Min;
  iVar14 = pTVar5->YAxis;
  IVar1 = pIVar13->PixelRange[iVar14].Min;
  IVar23.x = (float)(pIVar13->Mx *
                     (((double)(float)(dVar22 / pIVar13->LogDenX) *
                       ((pIVar6->XAxis).Range.Max - dVar10) + dVar10) - dVar10) + (double)IVar1.x);
  IVar23.y = (float)(pIVar13->My[iVar14] * (dVar2 - pIVar6->YAxis[iVar14].Range.Min) +
                    (double)IVar1.y);
  fVar25 = (this->P12).x;
  fVar27 = (this->P12).y;
  fVar29 = (this->P11).y;
  fVar34 = (this->P11).x;
  uVar20 = -(uint)(fVar29 < fVar27);
  fVar28 = (float)(~-(uint)(fVar25 <= fVar34) & (uint)fVar25 |
                  (uint)fVar34 & -(uint)(fVar25 <= fVar34));
  fVar30 = (float)(~-(uint)(fVar27 <= fVar29) & (uint)fVar27 |
                  (uint)fVar29 & -(uint)(fVar27 <= fVar29));
  fVar33 = (float)(~-(uint)(fVar34 < fVar25) & (uint)fVar25 |
                  (uint)fVar34 & -(uint)(fVar34 < fVar25));
  fVar42 = (float)(~uVar20 & (uint)fVar27 | (uint)fVar29 & uVar20);
  uVar17 = -(uint)(fVar24 <= fVar28);
  uVar18 = -(uint)(fVar26 <= fVar30);
  uVar19 = -(uint)(fVar33 < fVar24);
  uVar21 = -(uint)(fVar42 < fVar26);
  fVar28 = (float)(~uVar17 & (uint)fVar24 | (uint)fVar28 & uVar17);
  fVar30 = (float)(~uVar18 & (uint)fVar26 | (uint)fVar30 & uVar18);
  fVar33 = (float)(~uVar19 & (uint)fVar24 | (uint)fVar33 & uVar19);
  fVar42 = (float)(~uVar21 & (uint)fVar26 | (uint)fVar42 & uVar21);
  uVar17 = -(uint)(IVar23.x <= fVar28);
  uVar18 = -(uint)(IVar23.y <= fVar30);
  uVar19 = -(uint)(fVar33 < IVar23.x);
  uVar21 = -(uint)(fVar42 < IVar23.y);
  auVar32._0_4_ = (uint)fVar28 & uVar17;
  auVar32._4_4_ = (uint)fVar30 & uVar18;
  auVar32._8_4_ = (uint)fVar33 & uVar19;
  auVar32._12_4_ = (uint)fVar42 & uVar21;
  auVar39._0_4_ = ~uVar17 & (uint)IVar23.x;
  auVar39._4_4_ = ~uVar18 & (uint)IVar23.y;
  auVar39._8_4_ = ~uVar19 & (uint)IVar23.x;
  auVar39._12_4_ = ~uVar21 & (uint)IVar23.y;
  auVar39 = auVar39 | auVar32;
  fVar28 = (cull_rect->Min).y;
  auVar41._4_4_ = -(uint)(fVar28 < auVar39._4_4_);
  auVar41._0_4_ = -(uint)((cull_rect->Min).x < auVar39._0_4_);
  auVar11._4_8_ = auVar39._8_8_;
  auVar11._0_4_ = -(uint)(auVar39._4_4_ < fVar28);
  auVar40._0_8_ = auVar11._0_8_ << 0x20;
  auVar40._8_4_ = -(uint)(auVar39._8_4_ < (cull_rect->Max).x);
  auVar40._12_4_ = -(uint)(auVar39._12_4_ < (cull_rect->Max).y);
  auVar41._8_8_ = auVar40._8_8_;
  iVar14 = movmskps((int)pIVar6,auVar41);
  if (iVar14 == 0xf) {
    fVar30 = fVar26 * fVar34 - fVar29 * fVar24;
    fVar33 = IVar23.y * fVar25 - fVar27 * IVar23.x;
    fVar28 = fVar27 - IVar23.y;
    auVar35._4_4_ = fVar28;
    auVar35._0_4_ = fVar28;
    auVar35._8_4_ = fVar28;
    auVar35._12_4_ = fVar28;
    auVar36._4_12_ = auVar35._4_12_;
    auVar36._0_4_ = fVar28 * (fVar34 - fVar24) - (fVar29 - fVar26) * (fVar25 - IVar23.x);
    auVar31._0_4_ = fVar30 * (fVar25 - IVar23.x) - fVar33 * (fVar34 - fVar24);
    auVar31._4_4_ = fVar30 * fVar28 - fVar33 * (fVar29 - fVar26);
    auVar31._8_4_ = fVar26 * 0.0 - IVar23.y * 0.0;
    auVar31._12_4_ = fVar26 * 0.0 - IVar23.y * 0.0;
    auVar38._0_8_ = auVar36._0_8_;
    auVar38._8_4_ = fVar28;
    auVar38._12_4_ = fVar28;
    auVar37._8_8_ = auVar38._8_8_;
    auVar37._4_4_ = auVar36._0_4_;
    auVar37._0_4_ = auVar36._0_4_;
    auVar32 = divps(auVar31,auVar37);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8->col = this->Col;
    pIVar8[1].pos.x = fVar24;
    pIVar8[1].pos.y = fVar26;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[1].col = this->Col;
    pIVar8[2].pos = auVar32._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[2].col = this->Col;
    pIVar8[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[3].col = this->Col;
    pIVar8[4].pos = IVar23;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar8 = DrawList->_VtxWritePtr;
    pIVar8[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar8 + 5;
    uVar17 = DrawList->_VtxCurrentIdx;
    pIVar9 = DrawList->_IdxWritePtr;
    IVar16 = (ImDrawIdx)uVar17;
    *pIVar9 = IVar16;
    uVar15 = (byte)((byte)uVar20 & IVar23.y < fVar26 | -(fVar27 < fVar29) & -(fVar26 < IVar23.y)) &
             1;
    pIVar9[1] = IVar16 + uVar15 + 1;
    pIVar9[2] = IVar16 + 3;
    pIVar9[3] = IVar16 + 1;
    pIVar9[4] = (uVar15 ^ 3) + IVar16;
    pIVar9[5] = IVar16 + 4;
    DrawList->_IdxWritePtr = pIVar9 + 6;
    DrawList->_VtxCurrentIdx = uVar17 + 5;
  }
  (this->P11).x = fVar24;
  (this->P11).y = fVar26;
  (this->P12).x = IVar23.x;
  (this->P12).y = IVar23.y;
  return (char)iVar14 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }